

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimSnapshotManager.cpp
# Opt level: O0

bool __thiscall OpenMD::SimSnapshotManager::advance(SimSnapshotManager *this)

{
  int iVar1;
  Snapshot *in_RDI;
  Snapshot *in_stack_00000100;
  Snapshot *in_stack_ffffffffffffffe8;
  Snapshot *this_00;
  
  Snapshot::operator=(in_RDI,in_stack_ffffffffffffffe8);
  this_00 = (Snapshot *)
            (in_RDI->atomData).velocity.
            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar1 = Snapshot::getID((Snapshot *)
                          (in_RDI->atomData).velocity.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  Snapshot::setID(this_00,iVar1 + 1);
  Snapshot::clearDerivedProperties(in_stack_00000100);
  return true;
}

Assistant:

bool SimSnapshotManager::advance() {
    *previousSnapshot_ = *currentSnapshot_;
    currentSnapshot_->setID(currentSnapshot_->getID() + 1);
    currentSnapshot_->clearDerivedProperties();
    return true;
  }